

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall slang::parsing::Parser::parseSpecifyItem(Parser *this)

{
  TokenKind TVar1;
  SpecparamDeclarationSyntax *pSVar2;
  PulseStyleDeclarationSyntax *pPVar3;
  ExpressionSyntax *predicate;
  ConditionalPathDeclarationSyntax *pCVar4;
  SystemTimingCheckSyntax *pSVar5;
  PathDeclarationSyntax *pPVar6;
  Diagnostic *this_00;
  IfNonePathDeclarationSyntax *pIVar7;
  Token TVar8;
  Token TVar9;
  Token closeParen;
  Token keyword_00;
  SourceRange SVar10;
  Token keyword;
  Token local_a0;
  SyntaxNode *local_90;
  SyntaxNode *pSStack_88;
  size_t local_80;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_78;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  TVar1 = TVar8.kind;
  if (TVar1 < PulseStyleOnDetectKeyword) {
    if (TVar1 < IfKeyword) {
      if (TVar1 == SystemIdentifier) {
        pSVar5 = parseSystemTimingCheck(this);
        return &pSVar5->super_MemberSyntax;
      }
      if (TVar1 != OpenParenthesis) {
        return (MemberSyntax *)0x0;
      }
      pPVar6 = parsePathDeclaration(this);
      return &pPVar6->super_MemberSyntax;
    }
    if (TVar1 == IfKeyword) {
      TVar8 = ParserBase::consume(&this->super_ParserBase);
      TVar9 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      predicate = parseExpression(this);
      closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      pPVar6 = parsePathDeclaration(this);
      local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.childCount = 0;
      local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)0x0;
      local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
      _M_extent._M_extent_value = 0;
      local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005c8770;
      pCVar4 = slang::syntax::SyntaxFactory::conditionalPathDeclaration
                         (&this->factory,&local_68,TVar8,TVar9,predicate,closeParen,pPVar6);
      return &pCVar4->super_MemberSyntax;
    }
    if (TVar1 == IfNoneKeyword) {
      keyword_00 = ParserBase::consume(&this->super_ParserBase);
      local_a0 = keyword_00;
      pPVar6 = parsePathDeclaration(this);
      if ((((((pPVar6->desc).ptr)->suffix).ptr)->super_SyntaxNode).kind == EdgeSensitivePathSuffix)
      {
        SVar10 = Token::range(&local_a0);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5e0005,SVar10);
        SVar10 = slang::syntax::SyntaxNode::sourceRange
                           (&((((pPVar6->desc).ptr)->suffix).ptr)->super_SyntaxNode);
        Diagnostic::operator<<(this_00,SVar10);
        keyword_00 = local_a0;
      }
      local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.childCount = 0;
      local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)0x0;
      local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
      _M_extent._M_extent_value = 0;
      local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005c8770;
      pIVar7 = slang::syntax::SyntaxFactory::ifNonePathDeclaration
                         (&this->factory,&local_68,keyword_00,pPVar6);
      return &pIVar7->super_MemberSyntax;
    }
    if (TVar1 != NoShowCancelledKeyword) {
      return (MemberSyntax *)0x0;
    }
  }
  else if ((1 < TVar1 - 0xf6) && (TVar1 != ShowCancelledKeyword)) {
    if (TVar1 != SpecParamKeyword) {
      return (MemberSyntax *)0x0;
    }
    pSVar2 = parseSpecparam(this,(AttrList)(ZEXT416(0) << 0x40),SpecifyBlock);
    return &pSVar2->super_MemberSyntax;
  }
  TVar8 = ParserBase::consume(&this->super_ParserBase);
  local_78 = parsePathTerminals(this);
  local_80 = (size_t)local_78._M_extent._M_extent_value;
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.childCount = 0;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)0x0;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = 0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005c8770;
  local_a0.info._0_4_ = 3;
  local_90 = (SyntaxNode *)0x0;
  pSStack_88 = (SyntaxNode *)0x0;
  local_a0._0_8_ = &PTR_getChild_005cb5d0;
  TVar9 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pPVar3 = slang::syntax::SyntaxFactory::pulseStyleDeclaration
                     (&this->factory,&local_68,TVar8,
                      (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&local_a0,TVar9);
  return &pPVar3->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseSpecifyItem() {
    switch (peek().kind) {
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam({}, SyntaxKind::SpecifyBlock);
        case TokenKind::PulseStyleOnDetectKeyword:
        case TokenKind::PulseStyleOnEventKeyword:
        case TokenKind::ShowCancelledKeyword:
        case TokenKind::NoShowCancelledKeyword: {
            auto keyword = consume();
            auto names = parsePathTerminals();
            return &factory.pulseStyleDeclaration(nullptr, keyword, names,
                                                  expect(TokenKind::Semicolon));
        }
        case TokenKind::OpenParenthesis:
            return &parsePathDeclaration();
        case TokenKind::IfNoneKeyword: {
            auto keyword = consume();
            auto& path = parsePathDeclaration();
            if (path.desc->suffix->kind == SyntaxKind::EdgeSensitivePathSuffix) {
                addDiag(diag::IfNoneEdgeSensitive, keyword.range())
                    << path.desc->suffix->sourceRange();
            }

            return &factory.ifNonePathDeclaration(nullptr, keyword, path);
        }
        case TokenKind::IfKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& pred = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& path = parsePathDeclaration();
            return &factory.conditionalPathDeclaration(nullptr, keyword, openParen, pred,
                                                       closeParen, path);
        }
        case TokenKind::SystemIdentifier:
            return &parseSystemTimingCheck();
        default:
            // Otherwise, we got nothing and should just return null so that our caller
            // will skip and try again.
            return nullptr;
    }
}